

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlElement * __thiscall TiXmlNode::NextSiblingElement(TiXmlNode *this,char *_value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *local_28;
  TiXmlNode *node;
  char *_value_local;
  TiXmlNode *this_local;
  
  local_28 = NextSibling(this,_value);
  while( true ) {
    if (local_28 == (TiXmlNode *)0x0) {
      return (TiXmlElement *)0x0;
    }
    iVar1 = (*(local_28->super_TiXmlBase)._vptr_TiXmlBase[5])();
    if (CONCAT44(extraout_var,iVar1) != 0) break;
    local_28 = NextSibling(local_28,_value);
  }
  iVar1 = (*(local_28->super_TiXmlBase)._vptr_TiXmlBase[5])();
  return (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

const TiXmlElement* TiXmlNode::NextSiblingElement( const char * _value ) const
{
	const TiXmlNode* node;

	for (	node = NextSibling( _value );
			node;
			node = node->NextSibling( _value ) )
	{
		if ( node->ToElement() )
			return node->ToElement();
	}
	return 0;
}